

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int isoent_gen_joliet_identifier(archive_write *a,isoent *isoent,idr *idr)

{
  void *pvVar1;
  isoent *piVar2;
  isofile *piVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  wchar_t wVar7;
  char *pcVar8;
  ulong uVar9;
  int *piVar10;
  ulong uVar11;
  isoent *piVar12;
  uchar *p;
  isoent *piVar13;
  int iVar14;
  int noff;
  char *pcVar15;
  uint uVar16;
  ulong __n;
  ulong uVar17;
  archive_rb_tree_ops *in_stack_ffffffffffffff88;
  
  iVar14 = (isoent->children).cnt;
  iVar6 = 0;
  if (iVar14 != 0) {
    pvVar1 = a->format_data;
    uVar11 = 0x80;
    if ((*(uint *)((long)pvVar1 + 0x10370) & 0x60000) == 0x40000) {
      uVar11 = 0xce;
    }
    iVar6 = idr_start(a,idr,iVar14,6,2,0x1a8600,in_stack_ffffffffffffff88);
    if (-1 < iVar6) {
      uVar17 = 1;
      piVar2 = isoent->parent;
      piVar12 = isoent;
      if (isoent->parent != isoent) {
        do {
          piVar13 = piVar2;
          uVar17 = uVar17 + (long)piVar12->mb_len + 1;
          piVar2 = piVar13->parent;
          piVar12 = piVar13;
        } while (piVar13->parent != piVar13);
      }
      piVar2 = (isoent->children).first;
      if (piVar2 != (isoent *)0x0) {
        piVar12 = piVar2;
        do {
          piVar3 = piVar12->file;
          uVar4 = (piVar3->basename_utf16).length;
          __n = uVar11;
          if (uVar4 < uVar11) {
            __n = uVar4;
          }
          pcVar8 = (char *)malloc((__n & 0xffffffff) * 2 + 2);
          if (pcVar8 == (char *)0x0) {
            pcVar8 = "Can\'t allocate memory";
LAB_0015ba3b:
            archive_set_error(&a->archive,0xc,pcVar8);
            return -0x1e;
          }
          memcpy(pcVar8,(piVar3->basename_utf16).s,__n);
          pcVar15 = pcVar8 + __n;
          iVar14 = (int)pcVar15;
          (pcVar8 + __n)[0] = '\0';
          (pcVar8 + __n)[1] = '\0';
          piVar12->identifier = pcVar8;
          uVar9 = __n;
          uVar5 = uVar4;
          while (uVar5 != 0) {
            uVar16 = (uint)CONCAT11(*pcVar8,pcVar8[1]);
            if ((uVar16 < 0x20) ||
               ((uVar16 = uVar16 - 0x2a, uVar16 < 0x33 &&
                ((0x4000000230021U >> ((ulong)uVar16 & 0x3f) & 1) != 0)))) {
              pcVar8[0] = '\0';
              pcVar8[1] = '_';
            }
            else if ((*pcVar8 == '\0') && (pcVar8[1] == '.')) {
              pcVar15 = pcVar8;
            }
            iVar14 = (int)pcVar15;
            pcVar8 = pcVar8 + 2;
            uVar9 = uVar9 - 2;
            uVar5 = uVar9;
          }
          iVar14 = iVar14 - (int)piVar12->identifier;
          piVar12->ext_off = iVar14;
          piVar12->ext_len = (int)__n - iVar14;
          piVar12->id_len = (int)__n;
          if (uVar11 < (piVar12->file->basename_utf16).length) {
            wVar7 = archive_strncpy_l((archive_string *)((long)pvVar1 + 0x60),piVar12->identifier,
                                      __n,*(archive_string_conv **)((long)pvVar1 + 0x80));
            if ((wVar7 != L'\0') && (piVar10 = __errno_location(), *piVar10 == 0xc)) {
              pcVar8 = "No memory";
              goto LAB_0015ba3b;
            }
            iVar6 = *(int *)((long)pvVar1 + 0x68);
            piVar12->mb_len = iVar6;
            if (iVar6 == (int)(piVar12->file->basename).length) {
              iVar6 = 0;
            }
          }
          else {
            piVar12->mb_len = (int)(piVar12->file->basename).length;
            iVar6 = 0;
          }
          piVar13 = piVar2;
          if (((0xf0 < uVar17) || (piVar13 = piVar12, 0xf0 < (long)piVar12->mb_len)) ||
             (0xf0 < (long)piVar12->mb_len + uVar17)) {
            pcVar8 = archive_entry_pathname(piVar12->file->entry);
            archive_set_error(&a->archive,-1,
                              "The regulation of Joliet extensions; A length of a full-pathname of `%s\' is longer than 240 bytes, (p=%d, b=%d)"
                              ,pcVar8,uVar17 & 0xffffffff,(ulong)(uint)piVar13->mb_len);
            return -0x1e;
          }
          if (uVar4 < uVar11) {
            if (__n == uVar11 - 2) {
              noff = iVar14 + -4;
            }
            else {
              noff = iVar14 + -2;
              if (__n != uVar11 - 4) {
                noff = iVar14;
              }
            }
          }
          else {
            noff = iVar14 + -6;
          }
          idr_register(idr,piVar12,iVar6,noff);
          piVar12 = piVar12->chnext;
        } while (piVar12 != (isoent *)0x0);
      }
      idr_resolve(idr,idr_set_num_beutf16);
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

static int
isoent_gen_joliet_identifier(struct archive_write *a, struct isoent *isoent,
    struct idr *idr)
{
	struct iso9660 *iso9660;
	struct isoent *np;
	unsigned char *p;
	size_t l;
	int r;
	size_t ffmax, parent_len;
	static const struct archive_rb_tree_ops rb_ops = {
		isoent_cmp_node_joliet, isoent_cmp_key_joliet
	};

	if (isoent->children.cnt == 0)
		return (0);

	iso9660 = a->format_data;
	if (iso9660->opt.joliet == OPT_JOLIET_LONGNAME)
		ffmax = 206;
	else
		ffmax = 128;

	r = idr_start(a, idr, isoent->children.cnt, (int)ffmax, 6, 2, &rb_ops);
	if (r < 0)
		return (r);

	parent_len = 1;
	for (np = isoent; np->parent != np; np = np->parent)
		parent_len += np->mb_len + 1;

	for (np = isoent->children.first; np != NULL; np = np->chnext) {
		unsigned char *dot;
		int ext_off, noff, weight;
		size_t lt;

		if ((l = np->file->basename_utf16.length) > ffmax)
			l = ffmax;

		p = malloc((l+1)*2);
		if (p == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
			return (ARCHIVE_FATAL);
		}
		memcpy(p, np->file->basename_utf16.s, l);
		p[l] = 0;
		p[l+1] = 0;

		np->identifier = (char *)p;
		lt = l;
		dot = p + l;
		weight = 0;
		while (lt > 0) {
			if (!joliet_allowed_char(p[0], p[1]))
				archive_be16enc(p, 0x005F); /* '_' */
			else if (p[0] == 0 && p[1] == 0x2E) /* '.' */
				dot = p;
			p += 2;
			lt -= 2;
		}
		ext_off = (int)(dot - (unsigned char *)np->identifier);
		np->ext_off = ext_off;
		np->ext_len = (int)l - ext_off;
		np->id_len = (int)l;

		/*
		 * Get a length of MBS of a full-pathname.
		 */
		if (np->file->basename_utf16.length > ffmax) {
			if (archive_strncpy_l(&iso9660->mbs,
			    (const char *)np->identifier, l,
				iso9660->sconv_from_utf16be) != 0 &&
			    errno == ENOMEM) {
				archive_set_error(&a->archive, errno,
				    "No memory");
				return (ARCHIVE_FATAL);
			}
			np->mb_len = (int)iso9660->mbs.length;
			if (np->mb_len != (int)np->file->basename.length)
				weight = np->mb_len;
		} else
			np->mb_len = (int)np->file->basename.length;

		/* If a length of full-pathname is longer than 240 bytes,
		 * it violates Joliet extensions regulation. */
		if (parent_len > 240
		    || np->mb_len > 240
		    || parent_len + np->mb_len > 240) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "The regulation of Joliet extensions;"
			    " A length of a full-pathname of `%s' is "
			    "longer than 240 bytes, (p=%d, b=%d)",
			    archive_entry_pathname(np->file->entry),
			    (int)parent_len, (int)np->mb_len);
			return (ARCHIVE_FATAL);
		}

		/* Make an offset of the number which is used to be set
		 * hexadecimal number to avoid duplicate identifier. */
		if (l == ffmax)
			noff = ext_off - 6;
		else if (l == ffmax-2)
			noff = ext_off - 4;
		else if (l == ffmax-4)
			noff = ext_off - 2;
		else
			noff = ext_off;
		/* Register entry to the identifier resolver. */
		idr_register(idr, np, weight, noff);
	}

	/* Resolve duplicate identifier with Joliet Volume. */
	idr_resolve(idr, idr_set_num_beutf16);

	return (ARCHIVE_OK);
}